

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O3

void testWithTranslateRotateAndScale<double>(M44d *m)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ostream *poVar6;
  size_t numPoints;
  ulong uVar7;
  ulong numPoints_00;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> from;
  Rand48 rand;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> to;
  vector<double,_std::allocator<double>_> weights;
  Vec3<double> *local_1a8;
  Vec3<double> *pVStack_1a0;
  long local_198;
  ushort local_186 [3];
  double local_180;
  Vec3<double> *local_178;
  undefined8 uStack_170;
  long local_168;
  vector<double,_std::allocator<double>_> local_158;
  double local_140;
  undefined1 local_138 [16];
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  M44d local_b8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing with known translate/rotate/scale matrix\n",0x31);
  Imath_2_5::operator<<((ostream *)&std::cout,m);
  local_186[0] = 0xd35a;
  local_186[1] = 0xc826;
  local_186[2] = 0xd35a;
  local_198 = 0;
  local_1a8 = (Vec3<double> *)0x0;
  pVStack_1a0 = (Vec3<double> *)0x0;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"numPoints: ",0xb);
  std::ostream::flush();
  lVar8 = 1;
  do {
    local_180 = Imath_2_5::erand48(local_186);
    local_140 = Imath_2_5::erand48(local_186);
    local_128 = Imath_2_5::erand48(local_186);
    local_138._0_8_ = local_180;
    local_138._8_8_ = local_140;
    std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
    emplace_back<Imath_2_5::Vec3<double>>
              ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)&local_1a8
               ,(Vec3<double> *)local_138);
    local_138._0_8_ = Imath_2_5::erand48(local_186);
    if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_158,
                 (iterator)
                 local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)local_138);
    }
    else {
      *local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_138._0_8_;
      local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_180 = (double)lVar8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    local_178 = (Vec3<double> *)0x0;
    uStack_170 = 0;
    local_168 = 0;
    lVar8 = 0x10;
    uVar7 = 0;
    do {
      dVar13 = *(double *)((long)local_1a8 + lVar8 + -0x10);
      dVar2 = *(double *)((long)local_1a8 + lVar8 + -8);
      dVar3 = *(double *)((long)&local_1a8->x + lVar8);
      dVar14 = m->x[2][3] * dVar3 + m->x[0][3] * dVar13 + m->x[1][3] * dVar2 + m->x[3][3];
      local_128 = (m->x[2][2] * dVar3 + m->x[0][2] * dVar13 + m->x[1][2] * dVar2 + m->x[3][2]) /
                  dVar14;
      auVar9._0_8_ = dVar3 * m->x[2][0] + dVar13 * m->x[0][0] + m->x[1][0] * dVar2 + m->x[3][0];
      auVar9._8_8_ = dVar3 * m->x[2][1] + dVar13 * m->x[0][1] + m->x[1][1] * dVar2 + m->x[3][1];
      auVar11._8_8_ = dVar14;
      auVar11._0_8_ = dVar14;
      local_138 = divpd(auVar9,auVar11);
      std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
      emplace_back<Imath_2_5::Vec3<double>>
                ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)
                 &local_178,(Vec3<double> *)local_138);
      uVar7 = uVar7 + 1;
      numPoints_00 = ((long)pVStack_1a0 - (long)local_1a8 >> 3) * -0x5555555555555555;
      lVar8 = lVar8 + 0x18;
    } while (uVar7 < numPoints_00);
    Imath_2_5::procrustesRotationAndTranslation<double>
              ((M44d *)local_138,local_1a8,local_178,
               local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,numPoints_00,true);
    if (pVStack_1a0 == local_1a8) {
      numPoints = 0;
    }
    else {
      lVar8 = 0x10;
      uVar7 = 0;
      do {
        dVar13 = *(double *)((long)local_1a8 + lVar8 + -0x10);
        dVar2 = *(double *)((long)local_1a8 + lVar8 + -8);
        dVar3 = *(double *)((long)&local_1a8->x + lVar8);
        dVar14 = dStack_e0 * dVar3 + dStack_120 * dVar13 + dStack_100 * dVar2 + dStack_c0;
        local_b8.x[0][2] =
             (local_e8 * dVar3 + local_128 * dVar13 + local_108 * dVar2 + local_c8) / dVar14 -
             *(double *)((long)&local_178->x + lVar8);
        auVar10._0_8_ =
             dVar3 * local_f8 + dVar13 * (double)local_138._0_8_ + dVar2 * local_118 + local_d8;
        auVar10._8_8_ =
             dVar3 * dStack_f0 + dVar13 * (double)local_138._8_8_ + dVar2 * dStack_110 + dStack_d0;
        auVar4._8_8_ = dVar14;
        auVar4._0_8_ = dVar14;
        auVar11 = divpd(auVar10,auVar4);
        pdVar1 = (double *)((long)local_178 + lVar8 + -0x10);
        local_b8.x[0][0] = auVar11._0_8_ - *pdVar1;
        local_b8.x[0][1] = auVar11._8_8_ - pdVar1[1];
        dVar13 = local_b8.x[0][2] * local_b8.x[0][2] +
                 local_b8.x[0][0] * local_b8.x[0][0] + local_b8.x[0][1] * local_b8.x[0][1];
        if (4.450147717014403e-308 <= dVar13) {
          dVar13 = SQRT(dVar13);
        }
        else {
          dVar13 = Imath_2_5::Vec3<double>::lengthTiny((Vec3<double> *)&local_b8);
        }
        if (9.999999747378752e-05 <= dVar13) {
          __assert_fail("(from[i] * res - to[i]).length() < eps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                        ,0x75,
                        "void testWithTranslateRotateAndScale(const Imath_2_5::M44d &) [T = double]"
                       );
        }
        uVar7 = uVar7 + 1;
        numPoints = ((long)pVStack_1a0 - (long)local_1a8 >> 3) * -0x5555555555555555;
        lVar8 = lVar8 + 0x18;
      } while (uVar7 < numPoints);
    }
    Imath_2_5::procrustesRotationAndTranslation<double>
              (&local_b8,local_1a8,local_178,numPoints,true);
    local_138._8_8_ = local_b8.x[0][1];
    local_138._0_8_ = local_b8.x[0][0];
    local_128 = local_b8.x[0][2];
    dStack_120 = local_b8.x[0][3];
    local_118 = local_b8.x[1][0];
    dStack_110 = local_b8.x[1][1];
    local_108 = local_b8.x[1][2];
    dStack_100 = local_b8.x[1][3];
    local_f8 = local_b8.x[2][0];
    dStack_f0 = local_b8.x[2][1];
    local_e8 = local_b8.x[2][2];
    dStack_e0 = local_b8.x[2][3];
    local_d8 = local_b8.x[3][0];
    dStack_d0 = local_b8.x[3][1];
    local_c8 = local_b8.x[3][2];
    dStack_c0 = local_b8.x[3][3];
    if (pVStack_1a0 != local_1a8) {
      lVar8 = 0x10;
      uVar7 = 0;
      do {
        dVar13 = *(double *)((long)local_1a8 + lVar8 + -0x10);
        dVar2 = *(double *)((long)local_1a8 + lVar8 + -8);
        dVar3 = *(double *)((long)&local_1a8->x + lVar8);
        dVar14 = dStack_e0 * dVar3 + dStack_120 * dVar13 + dStack_100 * dVar2 + dStack_c0;
        local_b8.x[0][2] =
             (local_e8 * dVar3 + local_128 * dVar13 + local_108 * dVar2 + local_c8) / dVar14 -
             *(double *)((long)&local_178->x + lVar8);
        auVar12._0_8_ =
             dVar3 * local_f8 + dVar13 * (double)local_138._0_8_ + dVar2 * local_118 + local_d8;
        auVar12._8_8_ =
             dVar3 * dStack_f0 + dVar13 * (double)local_138._8_8_ + dVar2 * dStack_110 + dStack_d0;
        auVar5._8_8_ = dVar14;
        auVar5._0_8_ = dVar14;
        auVar11 = divpd(auVar12,auVar5);
        pdVar1 = (double *)((long)local_178 + lVar8 + -0x10);
        local_b8.x[0][0] = auVar11._0_8_ - *pdVar1;
        local_b8.x[0][1] = auVar11._8_8_ - pdVar1[1];
        dVar13 = local_b8.x[0][2] * local_b8.x[0][2] +
                 local_b8.x[0][0] * local_b8.x[0][0] + local_b8.x[0][1] * local_b8.x[0][1];
        if (4.450147717014403e-308 <= dVar13) {
          dVar13 = SQRT(dVar13);
        }
        else {
          dVar13 = Imath_2_5::Vec3<double>::lengthTiny((Vec3<double> *)&local_b8);
        }
        if (9.999999747378752e-05 <= dVar13) {
          __assert_fail("(from[i] * res - to[i]).length() < eps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                        ,0x7a,
                        "void testWithTranslateRotateAndScale(const Imath_2_5::M44d &) [T = double]"
                       );
        }
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x18;
      } while (uVar7 < (ulong)(((long)pVStack_1a0 - (long)local_1a8 >> 3) * -0x5555555555555555));
    }
    dVar13 = local_180;
    if (local_178 != (Vec3<double> *)0x0) {
      operator_delete(local_178,local_168 - (long)local_178);
    }
    lVar8 = (long)dVar13 + 1;
  } while (lVar8 != 10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  OK\n",5);
  if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a8 != (Vec3<double> *)0x0) {
    operator_delete(local_1a8,local_198 - (long)local_1a8);
  }
  return;
}

Assistant:

void testWithTranslateRotateAndScale (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing with known translate/rotate/scale matrix\n" << m;
    IMATH_INTERNAL_NAMESPACE::Rand48 rand(5376);

    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> V3;
    std::vector<V3> from;
    std::vector<T> weights;

    const float eps = 1e-4;
    std::cout << "numPoints: " << std::flush;
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        from.push_back (V3(rand.nextf(), rand.nextf(), rand.nextf()));
        weights.push_back (rand.nextf());
        std::cout << from.size() << " ";

        std::vector<V3> to;
        for (size_t i = 0; i < from.size(); ++i)
            to.push_back (from[i] * m);

        // weighted:
        IMATH_INTERNAL_NAMESPACE::M44d res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], from.size(), true);
        for (size_t i = 0; i < from.size(); ++i)
            assert ((from[i] * res - to[i]).length() < eps);

        // unweighted:
        res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (&from[0], &to[0], from.size(), true);
        for (size_t i = 0; i < from.size(); ++i)
            assert ((from[i] * res - to[i]).length() < eps);
    }
    std::cout << "  OK\n";
}